

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O3

void __thiscall
TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>::
TPZParFrontStructMatrix
          (TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_> *this,
          TPZCompMesh *mesh)

{
  undefined8 *puVar1;
  
  *(undefined8 *)&this->field_0x258 = 0x19ce590;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19ce658;
  *(undefined4 *)&this->field_0x260 = 0;
  this->field_0x264 = 1;
  TPZStructMatrix::TPZStructMatrix
            ((TPZStructMatrix *)this,&PTR_construction_vtable_104__019cb6c8,mesh);
  *(undefined8 *)&this->field_0x258 = 0x19ce068;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19cdf88;
  TPZStructMatrixOR<double>::TPZStructMatrixOR
            ((TPZStructMatrixOR<double> *)
             &(this->
              super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
              super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0,
             &PTR_construction_vtable_104__019cb6f0);
  *(undefined ***)
   &(this->super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa8 = &PTR__TPZVec_01813ef0;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
    field_0xb0 = 0;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
    field_0xb8 = 0;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
    field_0xc0 = 0;
  (this->super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
  f_quiet = 0;
  (this->super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
  fDecomposeType = ENoDecompose;
  *(undefined8 *)&this->field_0x258 = 0x19cb640;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19cb458;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x19cb540;
  puVar1 = (undefined8 *)operator_new(0x10);
  *(undefined4 *)(puVar1 + 1) = 0;
  *puVar1 = 0;
  LOCK();
  *(undefined4 *)(puVar1 + 1) = 1;
  UNLOCK();
  *(undefined8 **)
   &(this->super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
    field_0xd0 = puVar1;
  TPZStack<long,_10>::TPZStack(&this->felnum);
  TPZVec<TPZElementMatrix_*>::TPZVec((TPZVec<TPZElementMatrix_*> *)&this->fekstack,0);
  (this->fekstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fStore = (this->fekstack).super_TPZManVector<TPZElementMatrix_*,_10>.fExtAlloc;
  (this->fekstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fNElements = 0;
  (this->fekstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fNAlloc = 0;
  (this->fekstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019d5fb0;
  TPZVec<TPZElementMatrix_*>::TPZVec((TPZVec<TPZElementMatrix_*> *)&this->fefstack,0);
  (this->fefstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fStore = (this->fefstack).super_TPZManVector<TPZElementMatrix_*,_10>.fExtAlloc;
  (this->fefstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fNElements = 0;
  (this->fefstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fNAlloc = 0;
  (this->fefstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019d5fb0;
  this->fMaxStackSize = 500;
  *(undefined4 *)
   ((long)&(this->
           super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
           super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh +
   *(long *)(*(long *)&(this->
                       super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>
                       ).super_TPZStructMatrixT<double>.super_TPZStructMatrix + -0x60)) = 3;
  return;
}

Assistant:

TPZParFrontStructMatrix<TFront,TVar,TPar>::TPZParFrontStructMatrix(TPZCompMesh *mesh): TPZFrontStructMatrix<TFront,TVar,TPar>(mesh)
{
	fMaxStackSize = 500;
	TPZStructMatrix::SetNumThreads(3);
}